

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType2::AddValue(GridDataType2 *this,KFLOAT32 V)

{
  undefined1 *puVar1;
  value_type_conflict6 local_4;
  
  puVar1 = &(this->super_GridData).field_0xc;
  *(short *)puVar1 = *(short *)puVar1 + 1;
  std::vector<float,_std::allocator<float>_>::push_back(&this->m_vf32Values,&local_4);
  return;
}

Assistant:

void GridDataType2:: AddValue( KFLOAT32 V )
{
    ++m_ui16NumValues;
    m_vf32Values.push_back( V );
}